

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O3

half Imf_2_5::uintToHalf(uint ui)

{
  unsigned_short uVar1;
  float i;
  
  uVar1 = 0x7c00;
  if (ui < 0xffe1) {
    i = (float)(int)ui;
    if (ui == 0) {
      return (half)(unsigned_short)((uint)i >> 0x10);
    }
    if (half::_eLut[(uint)i >> 0x17] == 0) {
      uVar1 = half::convert((int)i);
      return (half)uVar1;
    }
    uVar1 = half::_eLut[(uint)i >> 0x17] +
            (short)(((uint)i & 0x7fffff) + 0xfff + (uint)(((uint)i >> 0xd & 1) != 0) >> 0xd);
  }
  return (half)uVar1;
}

Assistant:

half	
uintToHalf (unsigned int ui)
{
    if (ui >  HALF_MAX)
	return half::posInf();

    return half ((float) ui);
}